

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMParentNode.cpp
# Opt level: O0

DOMNode * __thiscall
xercesc_4_0::DOMParentNode::insertBefore(DOMParentNode *this,DOMNode *newChild,DOMNode *refChild)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  DOMException *pDVar4;
  DOMNodeImpl *pDVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DOMNode *pDVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long *plVar7;
  DOMChildNode *pDVar8;
  BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *this_00;
  XMLSize_t XVar9;
  DOMRangeImpl *this_01;
  DOMNode *local_230;
  MemoryManager *local_1c8;
  DOMDocumentImpl *local_1b8;
  MemoryManager *local_198;
  DOMDocumentImpl *local_188;
  MemoryManager *local_170;
  DOMDocumentImpl *local_160;
  MemoryManager *local_140;
  DOMDocumentImpl *local_130;
  MemoryManager *local_110;
  DOMDocumentImpl *local_100;
  MemoryManager *local_e8;
  DOMDocumentImpl *local_d8;
  MemoryManager *local_c0;
  DOMDocumentImpl *local_b0;
  ulong local_90;
  XMLSize_t i;
  XMLSize_t sz;
  Ranges *ranges;
  DOMNode *prev;
  DOMNode *lastChild;
  DOMChildNode *newChild_ci;
  DOMNode *oldparent;
  DOMNode *kid;
  DOMNode *a;
  bool treeSafe;
  DOMNodeImpl *thisNodeImpl;
  DOMNode *refChild_local;
  DOMNode *newChild_local;
  DOMParentNode *this_local;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  
  if (newChild == (DOMNode *)0x0) {
    pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fOwnerDocument == (DOMDocument *)0x0) {
      local_c0 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      if (this->fOwnerDocument == (DOMDocument *)0x0) {
        local_b0 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_b0 = (DOMDocumentImpl *)&this->fOwnerDocument[-1].super_DOMNode;
      }
      local_c0 = DOMDocumentImpl::getMemoryManager(local_b0);
    }
    DOMException::DOMException(pDVar4,3,0,local_c0);
    __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
  }
  pDVar5 = getContainingNodeImpl(this);
  bVar1 = DOMNodeImpl::isReadOnly(pDVar5);
  if (bVar1) {
    pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fOwnerDocument == (DOMDocument *)0x0) {
      local_e8 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      if (this->fOwnerDocument == (DOMDocument *)0x0) {
        local_d8 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_d8 = (DOMDocumentImpl *)&this->fOwnerDocument[-1].super_DOMNode;
      }
      local_e8 = DOMDocumentImpl::getMemoryManager(local_d8);
    }
    DOMException::DOMException(pDVar4,7,0,local_e8);
    __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
  }
  iVar2 = (*newChild->_vptr_DOMNode[0xc])();
  if ((DOMDocument *)CONCAT44(extraout_var,iVar2) != this->fOwnerDocument) {
    pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fOwnerDocument == (DOMDocument *)0x0) {
      local_110 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      if (this->fOwnerDocument == (DOMDocument *)0x0) {
        local_100 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_100 = (DOMDocumentImpl *)&this->fOwnerDocument[-1].super_DOMNode;
      }
      local_110 = DOMDocumentImpl::getMemoryManager(local_100);
    }
    DOMException::DOMException(pDVar4,4,0,local_110);
    __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
  }
  uVar3 = (*newChild->_vptr_DOMNode[0x12])();
  if ((uVar3 & 1) != 0) {
    bVar1 = true;
    pDVar6 = getContainingNode(this);
    iVar2 = (*pDVar6->_vptr_DOMNode[5])();
    kid = (DOMNode *)CONCAT44(extraout_var_00,iVar2);
    while (bVar1 && kid != (DOMNode *)0x0) {
      bVar1 = newChild != kid;
      iVar2 = (*kid->_vptr_DOMNode[5])();
      kid = (DOMNode *)CONCAT44(extraout_var_01,iVar2);
    }
    if (!bVar1) {
      pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
      if (this->fOwnerDocument == (DOMDocument *)0x0) {
        local_140 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        if (this->fOwnerDocument == (DOMDocument *)0x0) {
          local_130 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_130 = (DOMDocumentImpl *)&this->fOwnerDocument[-1].super_DOMNode;
        }
        local_140 = DOMDocumentImpl::getMemoryManager(local_130);
      }
      DOMException::DOMException(pDVar4,3,0,local_140);
      __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
    }
  }
  if (refChild != (DOMNode *)0x0) {
    iVar2 = (*refChild->_vptr_DOMNode[5])();
    pDVar6 = getContainingNode(this);
    if ((DOMNode *)CONCAT44(extraout_var_02,iVar2) != pDVar6) {
      pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
      if (this->fOwnerDocument == (DOMDocument *)0x0) {
        local_170 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        if (this->fOwnerDocument == (DOMDocument *)0x0) {
          local_160 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_160 = (DOMDocumentImpl *)&this->fOwnerDocument[-1].super_DOMNode;
        }
        local_170 = DOMDocumentImpl::getMemoryManager(local_160);
      }
      DOMException::DOMException(pDVar4,8,0,local_170);
      __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
    }
  }
  if ((refChild == (DOMNode *)0x0) ||
     (uVar3 = (*newChild->_vptr_DOMNode[0x1b])(newChild,refChild), (uVar3 & 1) == 0)) {
    iVar2 = (*newChild->_vptr_DOMNode[4])();
    if (iVar2 == 0xb) {
      iVar2 = (*newChild->_vptr_DOMNode[7])();
      oldparent = (DOMNode *)CONCAT44(extraout_var_03,iVar2);
      while (oldparent != (DOMNode *)0x0) {
        pDVar6 = getContainingNode(this);
        bVar1 = DOMDocumentImpl::isKidOK(pDVar6,oldparent);
        if (!bVar1) {
          pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
          if (this->fOwnerDocument == (DOMDocument *)0x0) {
            local_198 = XMLPlatformUtils::fgMemoryManager;
          }
          else {
            if (this->fOwnerDocument == (DOMDocument *)0x0) {
              local_188 = (DOMDocumentImpl *)0x0;
            }
            else {
              local_188 = (DOMDocumentImpl *)&this->fOwnerDocument[-1].super_DOMNode;
            }
            local_198 = DOMDocumentImpl::getMemoryManager(local_188);
          }
          DOMException::DOMException(pDVar4,3,0,local_198);
          __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
        }
        iVar2 = (*oldparent->_vptr_DOMNode[10])();
        oldparent = (DOMNode *)CONCAT44(extraout_var_04,iVar2);
      }
      while (uVar3 = (*newChild->_vptr_DOMNode[0x12])(), (uVar3 & 1) != 0) {
        pDVar6 = getContainingNode(this);
        iVar2 = (*newChild->_vptr_DOMNode[7])();
        (*pDVar6->_vptr_DOMNode[0xe])(pDVar6,CONCAT44(extraout_var_05,iVar2),refChild);
      }
    }
    else {
      pDVar6 = getContainingNode(this);
      bVar1 = DOMDocumentImpl::isKidOK(pDVar6,newChild);
      if (!bVar1) {
        pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
        if (this->fOwnerDocument == (DOMDocument *)0x0) {
          local_1c8 = XMLPlatformUtils::fgMemoryManager;
        }
        else {
          if (this->fOwnerDocument == (DOMDocument *)0x0) {
            local_1b8 = (DOMDocumentImpl *)0x0;
          }
          else {
            local_1b8 = (DOMDocumentImpl *)&this->fOwnerDocument[-1].super_DOMNode;
          }
          local_1c8 = DOMDocumentImpl::getMemoryManager(local_1b8);
        }
        DOMException::DOMException(pDVar4,3,0,local_1c8);
        __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
      }
      iVar2 = (*newChild->_vptr_DOMNode[5])();
      plVar7 = (long *)CONCAT44(extraout_var_06,iVar2);
      if (plVar7 != (long *)0x0) {
        (**(code **)(*plVar7 + 0x80))(plVar7,newChild);
      }
      pDVar6 = getContainingNode(this);
      pDVar5 = xercesc_4_0::castToNodeImpl(newChild);
      pDVar5->fOwnerNode = pDVar6;
      pDVar5 = xercesc_4_0::castToNodeImpl(newChild);
      DOMNodeImpl::isOwned(pDVar5,true);
      if (this->fFirstChild == (DOMNode *)0x0) {
        this->fFirstChild = newChild;
        pDVar5 = xercesc_4_0::castToNodeImpl(newChild);
        DOMNodeImpl::isFirstChild(pDVar5,true);
        pDVar8 = castToChildImpl(newChild);
        pDVar8->previousSibling = newChild;
      }
      else if (refChild == (DOMNode *)0x0) {
        pDVar8 = castToChildImpl(this->fFirstChild);
        pDVar6 = pDVar8->previousSibling;
        pDVar8 = castToChildImpl(pDVar6);
        pDVar8->nextSibling = newChild;
        pDVar8 = castToChildImpl(newChild);
        pDVar8->previousSibling = pDVar6;
        pDVar8 = castToChildImpl(this->fFirstChild);
        pDVar8->previousSibling = newChild;
      }
      else if (refChild == this->fFirstChild) {
        pDVar5 = xercesc_4_0::castToNodeImpl(this->fFirstChild);
        DOMNodeImpl::isFirstChild(pDVar5,false);
        pDVar6 = this->fFirstChild;
        pDVar8 = castToChildImpl(newChild);
        pDVar8->nextSibling = pDVar6;
        pDVar8 = castToChildImpl(this->fFirstChild);
        pDVar6 = pDVar8->previousSibling;
        pDVar8 = castToChildImpl(newChild);
        pDVar8->previousSibling = pDVar6;
        pDVar8 = castToChildImpl(this->fFirstChild);
        pDVar8->previousSibling = newChild;
        this->fFirstChild = newChild;
        pDVar5 = xercesc_4_0::castToNodeImpl(newChild);
        DOMNodeImpl::isFirstChild(pDVar5,true);
      }
      else {
        pDVar8 = castToChildImpl(refChild);
        pDVar6 = pDVar8->previousSibling;
        pDVar8 = castToChildImpl(newChild);
        pDVar8->nextSibling = refChild;
        pDVar8 = castToChildImpl(pDVar6);
        pDVar8->nextSibling = newChild;
        pDVar8 = castToChildImpl(refChild);
        pDVar8->previousSibling = newChild;
        pDVar8 = castToChildImpl(newChild);
        pDVar8->previousSibling = pDVar6;
      }
    }
    changed(this);
    if (this->fOwnerDocument != (DOMDocument *)0x0) {
      if (this->fOwnerDocument == (DOMDocument *)0x0) {
        local_230 = (DOMNode *)0x0;
      }
      else {
        local_230 = &this->fOwnerDocument[-1].super_DOMNode;
      }
      iVar2 = (*local_230->_vptr_DOMNode[0x46])();
      this_00 = (BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *)CONCAT44(extraout_var_07,iVar2);
      if ((this_00 != (BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *)0x0) &&
         (XVar9 = BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>::size(this_00), XVar9 != 0)) {
        for (local_90 = 0; local_90 < XVar9; local_90 = local_90 + 1) {
          this_01 = BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>::elementAt(this_00,local_90);
          DOMRangeImpl::updateRangeForInsertedNode(this_01,newChild);
        }
      }
    }
  }
  return newChild;
}

Assistant:

DOMNode *DOMParentNode::insertBefore(DOMNode *newChild, DOMNode *refChild) {
    //not really in the specs, but better than nothing
    if(newChild==NULL)
        throw DOMException(DOMException::HIERARCHY_REQUEST_ERR,0, GetDOMParentNodeMemoryManager);

    const DOMNodeImpl *thisNodeImpl = getContainingNodeImpl();
    if (thisNodeImpl->isReadOnly())
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMParentNodeMemoryManager);

    if (newChild->getOwnerDocument() != fOwnerDocument)
        throw DOMException(DOMException::WRONG_DOCUMENT_ERR, 0, GetDOMParentNodeMemoryManager);

    // Prevent cycles in the tree
    //only need to do this if the node has children
    if(newChild->hasChildNodes()) {
        bool treeSafe=true;
        for(DOMNode *a=getContainingNode()->getParentNode();
            treeSafe && a!=0;
            a=a->getParentNode())
            treeSafe=(newChild!=a);
        if(!treeSafe)
            throw DOMException(DOMException::HIERARCHY_REQUEST_ERR,0, GetDOMParentNodeMemoryManager);
    }

    // refChild must in fact be a child of this node (or 0)
    if (refChild!=0 && refChild->getParentNode() != getContainingNode())
        throw DOMException(DOMException::NOT_FOUND_ERR,0, GetDOMParentNodeMemoryManager);

    // if the new node has to be placed before itself, we don't have to do anything
    // (even worse, we would crash if we continue, as we assume they are two distinct nodes)
    if (refChild!=0 && newChild->isSameNode(refChild))
        return newChild;

    if (newChild->getNodeType() == DOMNode::DOCUMENT_FRAGMENT_NODE)
    {
        // SLOW BUT SAFE: We could insert the whole subtree without
        // juggling so many next/previous pointers. (Wipe out the
        // parent's child-list, patch the parent pointers, set the
        // ends of the list.) But we know some subclasses have special-
        // case behavior they add to insertBefore(), so we don't risk it.
        // This approch also takes fewer bytecodes.

        // NOTE: If one of the children is not a legal child of this
        // node, throw HIERARCHY_REQUEST_ERR before _any_ of the children
        // have been transferred. (Alternative behaviors would be to
        // reparent up to the first failure point or reparent all those
        // which are acceptable to the target node, neither of which is
        // as robust. PR-DOM-0818 isn't entirely clear on which it
        // recommends?????

        // No need to check kids for right-document; if they weren't,
        // they wouldn't be kids of that DocFrag.
        for(DOMNode *kid=newChild->getFirstChild(); // Prescan
              kid!=0;
              kid=kid->getNextSibling())
        {
            if (!DOMDocumentImpl::isKidOK(getContainingNode(), kid))
              throw DOMException(DOMException::HIERARCHY_REQUEST_ERR,0, GetDOMParentNodeMemoryManager);
        }
        while(newChild->hasChildNodes())     // Move
            getContainingNode()->insertBefore(newChild->getFirstChild(),refChild);
    }

    else if (!DOMDocumentImpl::isKidOK(getContainingNode(), newChild))
        throw DOMException(DOMException::HIERARCHY_REQUEST_ERR,0, GetDOMParentNodeMemoryManager);

    else
    {
        DOMNode *oldparent=newChild->getParentNode();
        if(oldparent!=0)
            oldparent->removeChild(newChild);

        // Attach up
        castToNodeImpl(newChild)->fOwnerNode = getContainingNode();
        castToNodeImpl(newChild)->isOwned(true);

        // Attach before and after
        // Note: fFirstChild.previousSibling == lastChild!!
        if (fFirstChild == 0) {
            // this our first and only child
            fFirstChild = newChild;
            castToNodeImpl(newChild)->isFirstChild(true);
            // castToChildImpl(newChild)->previousSibling = newChild;
            DOMChildNode *newChild_ci = castToChildImpl(newChild);
            newChild_ci->previousSibling = newChild;
        } else {
            if (refChild == 0) {
                // this is an append
                DOMNode *lastChild = castToChildImpl(fFirstChild)->previousSibling;
                castToChildImpl(lastChild)->nextSibling = newChild;
                castToChildImpl(newChild)->previousSibling = lastChild;
                castToChildImpl(fFirstChild)->previousSibling = newChild;
            } else {
                // this is an insert
                if (refChild == fFirstChild) {
                    // at the head of the list
                    castToNodeImpl(fFirstChild)->isFirstChild(false);
                    castToChildImpl(newChild)->nextSibling = fFirstChild;
                    castToChildImpl(newChild)->previousSibling = castToChildImpl(fFirstChild)->previousSibling;
                    castToChildImpl(fFirstChild)->previousSibling = newChild;
                    fFirstChild = newChild;
                    castToNodeImpl(newChild)->isFirstChild(true);
                } else {
                    // somewhere in the middle
                    DOMNode *prev = castToChildImpl(refChild)->previousSibling;
                    castToChildImpl(newChild)->nextSibling = refChild;
                    castToChildImpl(prev)->nextSibling = newChild;
                    castToChildImpl(refChild)->previousSibling = newChild;
                    castToChildImpl(newChild)->previousSibling = prev;
                }
            }
        }
    }

    changed();

    if (fOwnerDocument != 0) {
        Ranges* ranges = ((DOMDocumentImpl*)fOwnerDocument)->getRanges();
        if ( ranges != 0) {
            XMLSize_t sz = ranges->size();
            if (sz != 0) {
                for (XMLSize_t i =0; i<sz; i++) {
                    ranges->elementAt(i)->updateRangeForInsertedNode(newChild);
                }
            }
        }
    }

    return newChild;
}